

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O1

EulerAngles *
AML::converEulerAnglesXYZtoZXZ
          (EulerAngles *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dVar5 = cos(psi);
  dVar6 = sin(psi);
  dVar7 = atan2(-dVar4,dVar2 * dVar3);
  dVar3 = acos(dVar3 * dVar1);
  dVar1 = atan2(dVar1 * dVar4 * dVar5 + dVar2 * dVar6,dVar2 * dVar5 - dVar1 * dVar4 * dVar6);
  __return_storage_ptr__->phi = dVar7;
  __return_storage_ptr__->theta = dVar3;
  __return_storage_ptr__->psi = dVar1;
  __return_storage_ptr__->seq_ = ZXZ;
  return __return_storage_ptr__;
}

Assistant:

EulerAngles converEulerAnglesXYZtoZXZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cosPsi = cos(psi);
        const double sinPsi = sin(psi);
        const double phiZXZ = atan2(-sinTheta, sinPhi * cosTheta);
        const double thetaZXZ = acos(cosPhi * cosTheta);
        const double psiZXZ =
            atan2(cosPhi * sinTheta * cosPsi + sinPhi * sinPsi, -cosPhi * sinTheta * sinPsi + sinPhi * cosPsi);
        return EulerAngles(phiZXZ, thetaZXZ, psiZXZ, EulerAngles::EulerSequence::ZXZ);
    }